

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

Node * __thiscall anon_unknown.dwarf_426d84::Db::parseUnresolvedType(Db *this)

{
  char cVar1;
  Db *local_28;
  Node *DT;
  Node *TP;
  Db *this_local;
  
  TP = (Node *)this;
  cVar1 = look(this,0);
  if (cVar1 == 'T') {
    DT = parseTemplateParam(this);
    if (DT == (Node *)0x0) {
      this_local = (Db *)0x0;
    }
    else {
      PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(&this->Subs,&DT);
      this_local = (Db *)DT;
    }
  }
  else {
    cVar1 = look(this,0);
    if (cVar1 == 'D') {
      local_28 = (Db *)parseDecltype(this);
      if (local_28 == (Db *)0x0) {
        this_local = (Db *)0x0;
      }
      else {
        PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back
                  (&this->Subs,(Node **)&local_28);
        this_local = local_28;
      }
    }
    else {
      this_local = (Db *)parseSubstitution(this);
    }
  }
  return (Node *)this_local;
}

Assistant:

Node *Db::parseUnresolvedType() {
  if (look() == 'T') {
    Node *TP = parseTemplateParam();
    if (TP == nullptr)
      return nullptr;
    Subs.push_back(TP);
    return TP;
  }
  if (look() == 'D') {
    Node *DT = parseDecltype();
    if (DT == nullptr)
      return nullptr;
    Subs.push_back(DT);
    return DT;
  }
  return parseSubstitution();
}